

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsdevice.cpp
# Opt level: O1

void __thiscall
QEglFSKmsDevice::registerScreen
          (QEglFSKmsDevice *this,QPlatformScreen *screen,bool isPrimary,QPoint *virtualPos,
          QList<QPlatformScreen_*> *virtualSiblings)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QPlatformScreen_*> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QEglFSKmsScreen::setVirtualPosition((QEglFSKmsScreen *)screen,virtualPos);
  local_38.d = (virtualSiblings->d).d;
  local_38.ptr = (virtualSiblings->d).ptr;
  local_38.size = (virtualSiblings->d).size;
  if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_38.d)->super_QArrayData).ref_)->ref_)._q_value.super___atomic_base<int>
    ._M_i = (((QArrayData *)&((local_38.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QArrayDataPointer<QPlatformScreen_*>::operator=
            ((QArrayDataPointer<QPlatformScreen_*> *)(screen + 0x200),&local_38);
  if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d)->super_QArrayData,8,0x10);
    }
  }
  QWindowSystemInterface::handleScreenAdded(screen,isPrimary);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSKmsDevice::registerScreen(QPlatformScreen *screen,
                                     bool isPrimary,
                                     const QPoint &virtualPos,
                                     const QList<QPlatformScreen *> &virtualSiblings)
{
    QEglFSKmsScreen *s = static_cast<QEglFSKmsScreen *>(screen);
    s->setVirtualPosition(virtualPos);
    s->setVirtualSiblings(virtualSiblings);
    QWindowSystemInterface::handleScreenAdded(s, isPrimary);
}